

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_frameChunk
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 U32 lastFrameChunk)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ZSTD_matchState_t *ms_00;
  size_t code;
  U32 local_b0;
  U32 cBlockHeader;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  size_t cSize;
  U32 lastBlock;
  ZSTD_matchState_t *ms;
  void *pvStack_68;
  U32 maxDist;
  BYTE *op;
  BYTE *ostart;
  BYTE *ip;
  size_t remaining;
  size_t blockSize;
  U32 lastFrameChunk_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  remaining = cctx->blockSize;
  uVar1 = (cctx->appliedParams).cParams.windowLog;
  pvStack_68 = dst;
  ostart = (BYTE *)src;
  ip = (BYTE *)srcSize;
  src_local = (void *)dstCapacity;
  if (((cctx->appliedParams).fParams.checksumFlag != 0) && (srcSize != 0)) {
    XXH64_update(&cctx->xxhState,src,srcSize);
  }
  do {
    if (ip == (BYTE *)0x0) {
      if ((lastFrameChunk != 0) && (dst < pvStack_68)) {
        cctx->stage = ZSTDcs_ending;
      }
      return (long)pvStack_68 - (long)dst;
    }
    ms_00 = &(cctx->blockState).matchState;
    uVar2 = lastFrameChunk & ip <= remaining;
    if (src_local < (void *)0x6) {
      return 0xffffffffffffffba;
    }
    if (ip < remaining) {
      remaining = (size_t)ip;
    }
    ZSTD_overflowCorrectIfNeeded
              (ms_00,&cctx->workspace,&cctx->appliedParams,ostart,ostart + remaining);
    ZSTD_checkDictValidity
              (&ms_00->window,ostart + remaining,1 << ((byte)uVar1 & 0x1f),
               &(cctx->blockState).matchState.loadedDictEnd,
               &(cctx->blockState).matchState.dictMatchState);
    if ((cctx->blockState).matchState.nextToUpdate < (cctx->blockState).matchState.window.lowLimit)
    {
      (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.lowLimit;
    }
    iVar3 = ZSTD_useTargetCBlockSize(&cctx->appliedParams);
    if (iVar3 == 0) {
      iVar3 = ZSTD_blockSplitterEnabled(&cctx->appliedParams);
      if (iVar3 != 0) {
        err_code = ZSTD_compressBlock_splitBlock
                             (cctx,pvStack_68,(size_t)src_local,ostart,remaining,uVar2);
        uVar2 = ERR_isError(err_code);
        goto joined_r0x00ba3bc9;
      }
      code = ZSTD_compressBlock_internal
                       (cctx,(void *)((long)pvStack_68 + 3),(long)src_local - 3,ostart,remaining,1);
      uVar4 = ERR_isError(code);
      if (uVar4 != 0) {
        return code;
      }
      if (code == 0) {
        err_code = ZSTD_noCompressBlock(pvStack_68,(size_t)src_local,ostart,remaining,uVar2);
        uVar2 = ERR_isError(err_code);
        goto joined_r0x00ba3bc9;
      }
      if (code == 1) {
        local_b0 = uVar2 + 2 + (int)(remaining << 3);
      }
      else {
        local_b0 = uVar2 + 4 + (int)(code << 3);
      }
      MEM_writeLE24(pvStack_68,local_b0);
      err_code = code + 3;
    }
    else {
      err_code = ZSTD_compressBlock_targetCBlockSize
                           (cctx,pvStack_68,(size_t)src_local,ostart,remaining,uVar2);
      uVar2 = ERR_isError(err_code);
joined_r0x00ba3bc9:
      if (uVar2 != 0) {
        return err_code;
      }
    }
    ostart = ostart + remaining;
    ip = ip + -remaining;
    pvStack_68 = (void *)(err_code + (long)pvStack_68);
    src_local = (void *)((long)src_local - err_code);
    cctx->isFirstBlock = 0;
  } while( true );
}

Assistant:

static size_t ZSTD_compress_frameChunk(ZSTD_CCtx* cctx,
                                     void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                                     U32 lastFrameChunk)
{
    size_t blockSize = cctx->blockSize;
    size_t remaining = srcSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* op = ostart;
    U32 const maxDist = (U32)1 << cctx->appliedParams.cParams.windowLog;

    assert(cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX);

    DEBUGLOG(4, "ZSTD_compress_frameChunk (blockSize=%u)", (unsigned)blockSize);
    if (cctx->appliedParams.fParams.checksumFlag && srcSize)
        XXH64_update(&cctx->xxhState, src, srcSize);

    while (remaining) {
        ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
        U32 const lastBlock = lastFrameChunk & (blockSize >= remaining);

        RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize + MIN_CBLOCK_SIZE,
                        dstSize_tooSmall,
                        "not enough space to store compressed block");
        if (remaining < blockSize) blockSize = remaining;

        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams, ip, ip + blockSize);
        ZSTD_checkDictValidity(&ms->window, ip + blockSize, maxDist, &ms->loadedDictEnd, &ms->dictMatchState);

        /* Ensure hash/chain table insertion resumes no sooner than lowlimit */
        if (ms->nextToUpdate < ms->window.lowLimit) ms->nextToUpdate = ms->window.lowLimit;

        {   size_t cSize;
            if (ZSTD_useTargetCBlockSize(&cctx->appliedParams)) {
                cSize = ZSTD_compressBlock_targetCBlockSize(cctx, op, dstCapacity, ip, blockSize, lastBlock);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressBlock_targetCBlockSize failed");
                assert(cSize > 0);
                assert(cSize <= blockSize + ZSTD_blockHeaderSize);
            } else if (ZSTD_blockSplitterEnabled(&cctx->appliedParams)) {
                cSize = ZSTD_compressBlock_splitBlock(cctx, op, dstCapacity, ip, blockSize, lastBlock);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressBlock_splitBlock failed");
                assert(cSize > 0 || cctx->seqCollector.collectSequences == 1);
            } else {
                cSize = ZSTD_compressBlock_internal(cctx,
                                        op+ZSTD_blockHeaderSize, dstCapacity-ZSTD_blockHeaderSize,
                                        ip, blockSize, 1 /* frame */);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressBlock_internal failed");

                if (cSize == 0) {  /* block is not compressible */
                    cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
                    FORWARD_IF_ERROR(cSize, "ZSTD_noCompressBlock failed");
                } else {
                    U32 const cBlockHeader = cSize == 1 ?
                        lastBlock + (((U32)bt_rle)<<1) + (U32)(blockSize << 3) :
                        lastBlock + (((U32)bt_compressed)<<1) + (U32)(cSize << 3);
                    MEM_writeLE24(op, cBlockHeader);
                    cSize += ZSTD_blockHeaderSize;
                }
            }


            ip += blockSize;
            assert(remaining >= blockSize);
            remaining -= blockSize;
            op += cSize;
            assert(dstCapacity >= cSize);
            dstCapacity -= cSize;
            cctx->isFirstBlock = 0;
            DEBUGLOG(5, "ZSTD_compress_frameChunk: adding a block of size %u",
                        (unsigned)cSize);
    }   }

    if (lastFrameChunk && (op>ostart)) cctx->stage = ZSTDcs_ending;
    return (size_t)(op-ostart);
}